

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

__m128i paeth_8x1_pred(__m128i *left,__m128i *top,__m128i *topleft)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  __m128i alVar8;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  __m128i mask2;
  __m128i mask1;
  __m128i ptl;
  __m128i pt;
  __m128i pl;
  __m128i base;
  __m128i *topleft_local;
  __m128i *top_local;
  __m128i *left_local;
  
  lVar1 = (*top)[0];
  lVar2 = (*top)[1];
  lVar3 = (*left)[0];
  lVar4 = (*left)[1];
  local_208 = (short)lVar1;
  sStack_206 = (short)((ulong)lVar1 >> 0x10);
  sStack_204 = (short)((ulong)lVar1 >> 0x20);
  sStack_202 = (short)((ulong)lVar1 >> 0x30);
  sStack_200 = (short)lVar2;
  sStack_1fe = (short)((ulong)lVar2 >> 0x10);
  sStack_1fc = (short)((ulong)lVar2 >> 0x20);
  sStack_1fa = (short)((ulong)lVar2 >> 0x30);
  local_218 = (short)lVar3;
  sStack_216 = (short)((ulong)lVar3 >> 0x10);
  sStack_214 = (short)((ulong)lVar3 >> 0x20);
  sStack_212 = (short)((ulong)lVar3 >> 0x30);
  sStack_210 = (short)lVar4;
  sStack_20e = (short)((ulong)lVar4 >> 0x10);
  sStack_20c = (short)((ulong)lVar4 >> 0x20);
  sStack_20a = (short)((ulong)lVar4 >> 0x30);
  lVar1 = (*topleft)[0];
  lVar2 = (*topleft)[1];
  local_198 = (short)lVar1;
  sStack_196 = (short)((ulong)lVar1 >> 0x10);
  sStack_194 = (short)((ulong)lVar1 >> 0x20);
  sStack_192 = (short)((ulong)lVar1 >> 0x30);
  sStack_190 = (short)lVar2;
  sStack_18e = (short)((ulong)lVar2 >> 0x10);
  sStack_18c = (short)((ulong)lVar2 >> 0x20);
  sStack_18a = (short)((ulong)lVar2 >> 0x30);
  local_198 = (local_208 + local_218) - local_198;
  sStack_196 = (sStack_206 + sStack_216) - sStack_196;
  sStack_194 = (sStack_204 + sStack_214) - sStack_194;
  sStack_192 = (sStack_202 + sStack_212) - sStack_192;
  sStack_190 = (sStack_200 + sStack_210) - sStack_190;
  sStack_18e = (sStack_1fe + sStack_20e) - sStack_18e;
  sStack_18c = (sStack_1fc + sStack_20c) - sStack_18c;
  sStack_18a = (sStack_1fa + sStack_20a) - sStack_18a;
  lVar1 = (*left)[0];
  lVar2 = (*left)[1];
  local_1b8 = (short)lVar1;
  sStack_1b6 = (short)((ulong)lVar1 >> 0x10);
  sStack_1b4 = (short)((ulong)lVar1 >> 0x20);
  sStack_1b2 = (short)((ulong)lVar1 >> 0x30);
  sStack_1b0 = (short)lVar2;
  sStack_1ae = (short)((ulong)lVar2 >> 0x10);
  sStack_1ac = (short)((ulong)lVar2 >> 0x20);
  sStack_1aa = (short)((ulong)lVar2 >> 0x30);
  auVar5._0_2_ = local_198 - local_1b8;
  auVar5._2_2_ = sStack_196 - sStack_1b6;
  auVar5._4_2_ = sStack_194 - sStack_1b4;
  auVar5._6_2_ = sStack_192 - sStack_1b2;
  auVar5._8_2_ = sStack_190 - sStack_1b0;
  auVar5._10_2_ = sStack_18e - sStack_1ae;
  auVar5._12_2_ = sStack_18c - sStack_1ac;
  auVar5._14_2_ = sStack_18a - sStack_1aa;
  pabsw(auVar5,auVar5);
  lVar1 = (*top)[0];
  lVar2 = (*top)[1];
  local_1d8 = (short)lVar1;
  sStack_1d6 = (short)((ulong)lVar1 >> 0x10);
  sStack_1d4 = (short)((ulong)lVar1 >> 0x20);
  sStack_1d2 = (short)((ulong)lVar1 >> 0x30);
  sStack_1d0 = (short)lVar2;
  sStack_1ce = (short)((ulong)lVar2 >> 0x10);
  sStack_1cc = (short)((ulong)lVar2 >> 0x20);
  sStack_1ca = (short)((ulong)lVar2 >> 0x30);
  auVar6._0_2_ = local_198 - local_1d8;
  auVar6._2_2_ = sStack_196 - sStack_1d6;
  auVar6._4_2_ = sStack_194 - sStack_1d4;
  auVar6._6_2_ = sStack_192 - sStack_1d2;
  auVar6._8_2_ = sStack_190 - sStack_1d0;
  auVar6._10_2_ = sStack_18e - sStack_1ce;
  auVar6._12_2_ = sStack_18c - sStack_1cc;
  auVar6._14_2_ = sStack_18a - sStack_1ca;
  pabsw(auVar6,auVar6);
  lVar1 = (*topleft)[0];
  lVar2 = (*topleft)[1];
  local_1f8 = (short)lVar1;
  sStack_1f6 = (short)((ulong)lVar1 >> 0x10);
  sStack_1f4 = (short)((ulong)lVar1 >> 0x20);
  sStack_1f2 = (short)((ulong)lVar1 >> 0x30);
  sStack_1f0 = (short)lVar2;
  sStack_1ee = (short)((ulong)lVar2 >> 0x10);
  sStack_1ec = (short)((ulong)lVar2 >> 0x20);
  sStack_1ea = (short)((ulong)lVar2 >> 0x30);
  auVar7._0_2_ = local_198 - local_1f8;
  auVar7._2_2_ = sStack_196 - sStack_1f6;
  auVar7._4_2_ = sStack_194 - sStack_1f4;
  auVar7._6_2_ = sStack_192 - sStack_1f2;
  auVar7._8_2_ = sStack_190 - sStack_1f0;
  auVar7._10_2_ = sStack_18e - sStack_1ee;
  auVar7._12_2_ = sStack_18c - sStack_1ec;
  auVar7._14_2_ = sStack_18a - sStack_1ea;
  pabsw(auVar7,auVar7);
  alVar8[1] = (longlong)topleft;
  alVar8[0] = (longlong)top;
  return alVar8;
}

Assistant:

static inline __m128i paeth_8x1_pred(const __m128i *left, const __m128i *top,
                                     const __m128i *topleft) {
  const __m128i base = _mm_sub_epi16(_mm_add_epi16(*top, *left), *topleft);

  __m128i pl = _mm_abs_epi16(_mm_sub_epi16(base, *left));
  __m128i pt = _mm_abs_epi16(_mm_sub_epi16(base, *top));
  __m128i ptl = _mm_abs_epi16(_mm_sub_epi16(base, *topleft));

  __m128i mask1 = _mm_cmpgt_epi16(pl, pt);
  mask1 = _mm_or_si128(mask1, _mm_cmpgt_epi16(pl, ptl));
  __m128i mask2 = _mm_cmpgt_epi16(pt, ptl);

  pl = _mm_andnot_si128(mask1, *left);

  ptl = _mm_and_si128(mask2, *topleft);
  pt = _mm_andnot_si128(mask2, *top);
  pt = _mm_or_si128(pt, ptl);
  pt = _mm_and_si128(mask1, pt);

  return _mm_or_si128(pl, pt);
}